

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

void Dsd_TreePrint_rec(FILE *pFile,Dsd_Node_t *pNode,int fComp,char **pInputNames,char *pOutputName,
                      int nOffset,int *pSigCounter,int fShortNames)

{
  int iVar1;
  uint uVar2;
  Dsd_Node_t *pDVar3;
  short sVar4;
  void *__ptr;
  long lVar5;
  char *pcVar6;
  Dsd_Node_t *pDVar7;
  char Buffer [100];
  
  if (4 < pNode->Type - DSD_NODE_CONST1) {
    __assert_fail("pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_CONST1 || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                  ,0x2ab,
                  "void Dsd_TreePrint_rec(FILE *, Dsd_Node_t *, int, char **, char *, int, int *, int)"
                 );
  }
  Extra_PrintSymbols(pFile,' ',nOffset,0);
  pcVar6 = "NOT(%s) = ";
  if (fComp == 0) {
    pcVar6 = "%s = ";
  }
  fprintf((FILE *)pFile,pcVar6,pOutputName);
  __ptr = malloc((long)pNode->nDecs << 2);
  switch(pNode->Type) {
  case DSD_NODE_CONST1:
    fwrite(" Constant 1.\n",0xd,1,(FILE *)pFile);
    break;
  case DSD_NODE_BUF:
    uVar2 = pNode->S->index;
    if (fShortNames == 0) {
      fputs(pInputNames[uVar2],(FILE *)pFile);
    }
    else {
      fprintf((FILE *)pFile,"%d",(ulong)(uVar2 + 0x61));
    }
    fputc(10,(FILE *)pFile);
    break;
  case DSD_NODE_OR:
    fwrite("OR(",3,1,(FILE *)pFile);
    if (0 < pNode->nDecs) {
      lVar5 = 0;
      do {
        pDVar3 = pNode->pDecs[lVar5];
        if (lVar5 != 0) {
          fputc(0x2c,(FILE *)pFile);
        }
        pDVar7 = (Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
        if (pDVar3 == pDVar7) {
          fputc(0x20,(FILE *)pFile);
        }
        else {
          fwrite(" NOT(",5,1,(FILE *)pFile);
        }
        if (pDVar7->Type == DSD_NODE_BUF) {
          *(undefined4 *)((long)__ptr + lVar5 * 4) = 0;
          uVar2 = pDVar7->S->index;
          if (fShortNames == 0) {
            fputs(pInputNames[uVar2],(FILE *)pFile);
          }
          else {
            fputc(uVar2 + 0x61,(FILE *)pFile);
          }
        }
        else {
          iVar1 = *pSigCounter;
          *pSigCounter = iVar1 + 1;
          *(int *)((long)__ptr + lVar5 * 4) = iVar1;
          fprintf((FILE *)pFile,"<%d>");
        }
        if (pDVar3 != pDVar7) {
          fputc(0x29,(FILE *)pFile);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pNode->nDecs);
    }
    fwrite(" )\n",3,1,(FILE *)pFile);
    sVar4 = pNode->nDecs;
    if (sVar4 < 1) break;
    lVar5 = 0;
    do {
      if (*(int *)((long)__ptr + lVar5 * 4) != 0) {
        sprintf(Buffer,"<%d>");
        Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar5] & 0xfffffffffffffffe),0,
                          pInputNames,Buffer,nOffset + 6,pSigCounter,fShortNames);
        sVar4 = pNode->nDecs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < sVar4);
    goto LAB_00813bac;
  case DSD_NODE_EXOR:
    fwrite("EXOR(",5,1,(FILE *)pFile);
    if (0 < pNode->nDecs) {
      lVar5 = 0;
      do {
        pDVar3 = pNode->pDecs[lVar5];
        if (lVar5 != 0) {
          fputc(0x2c,(FILE *)pFile);
        }
        pDVar7 = (Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
        if (pDVar3 == pDVar7) {
          fputc(0x20,(FILE *)pFile);
        }
        else {
          fwrite(" NOT(",5,1,(FILE *)pFile);
        }
        if (pDVar7->Type == DSD_NODE_BUF) {
          *(undefined4 *)((long)__ptr + lVar5 * 4) = 0;
          uVar2 = pDVar7->S->index;
          if (fShortNames == 0) {
            fputs(pInputNames[uVar2],(FILE *)pFile);
          }
          else {
            fputc(uVar2 + 0x61,(FILE *)pFile);
          }
        }
        else {
          iVar1 = *pSigCounter;
          *pSigCounter = iVar1 + 1;
          *(int *)((long)__ptr + lVar5 * 4) = iVar1;
          fprintf((FILE *)pFile,"<%d>");
        }
        if (pDVar3 != pDVar7) {
          fputc(0x29,(FILE *)pFile);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pNode->nDecs);
    }
    fwrite(" )\n",3,1,(FILE *)pFile);
    sVar4 = pNode->nDecs;
    if (0 < sVar4) {
      lVar5 = 0;
      do {
        if (*(int *)((long)__ptr + lVar5 * 4) != 0) {
          sprintf(Buffer,"<%d>");
          Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar5] & 0xfffffffffffffffe),0,
                            pInputNames,Buffer,nOffset + 6,pSigCounter,fShortNames);
          sVar4 = pNode->nDecs;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < sVar4);
      goto LAB_00813bac;
    }
    break;
  case DSD_NODE_PRIME:
    fwrite("PRIME(",6,1,(FILE *)pFile);
    if (0 < pNode->nDecs) {
      lVar5 = 0;
      do {
        pDVar3 = pNode->pDecs[lVar5];
        if (lVar5 != 0) {
          fputc(0x2c,(FILE *)pFile);
        }
        pDVar7 = (Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
        if (pDVar3 == pDVar7) {
          fputc(0x20,(FILE *)pFile);
        }
        else {
          fwrite(" NOT(",5,1,(FILE *)pFile);
        }
        if (pDVar7->Type == DSD_NODE_BUF) {
          *(undefined4 *)((long)__ptr + lVar5 * 4) = 0;
          if (fShortNames != 0) {
            pcVar6 = "%d";
            goto LAB_00813755;
          }
          fputs(pInputNames[pDVar7->S->index],(FILE *)pFile);
        }
        else {
          iVar1 = *pSigCounter;
          *pSigCounter = iVar1 + 1;
          *(int *)((long)__ptr + lVar5 * 4) = iVar1;
          pcVar6 = "<%d>";
LAB_00813755:
          fprintf((FILE *)pFile,pcVar6);
        }
        if (pDVar3 != pDVar7) {
          fputc(0x29,(FILE *)pFile);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pNode->nDecs);
    }
    fwrite(" )\n",3,1,(FILE *)pFile);
    sVar4 = pNode->nDecs;
    if (0 < sVar4) {
      lVar5 = 0;
      do {
        if (*(int *)((long)__ptr + lVar5 * 4) != 0) {
          sprintf(Buffer,"<%d>");
          Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar5] & 0xfffffffffffffffe),0,
                            pInputNames,Buffer,nOffset + 6,pSigCounter,fShortNames);
          sVar4 = pNode->nDecs;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < sVar4);
      goto LAB_00813bac;
    }
  }
  if (__ptr != (void *)0x0) {
LAB_00813bac:
    free(__ptr);
  }
  return;
}

Assistant:

void Dsd_TreePrint_rec( FILE * pFile, Dsd_Node_t * pNode, int fComp, char * pInputNames[], char * pOutputName, int nOffset, int * pSigCounter, int fShortNames )
{
    char Buffer[100];
    Dsd_Node_t * pInput;
    int * pInputNums;
    int fCompNew, i;

    assert( pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_CONST1 || 
        pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR ); 

    Extra_PrintSymbols( pFile, ' ', nOffset, 0 );
    if ( !fComp )
        fprintf( pFile, "%s = ", pOutputName );
    else
        fprintf( pFile, "NOT(%s) = ", pOutputName );
    pInputNums = ABC_ALLOC( int, pNode->nDecs );
    if ( pNode->Type == DSD_NODE_CONST1 )
    {
        fprintf( pFile, " Constant 1.\n" );
    }
    else if ( pNode->Type == DSD_NODE_BUF )
    {
        if ( fShortNames )
            fprintf( pFile, "%d", 'a' + pNode->S->index );
        else
            fprintf( pFile, "%s", pInputNames[pNode->S->index] );
        fprintf( pFile, "\n" );
    }
    else if ( pNode->Type == DSD_NODE_PRIME )
    {
        // print the line
        fprintf( pFile, "PRIME(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput   = Dsd_Regular( pNode->pDecs[i] );
            fCompNew = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%d", pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput   = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    else if ( pNode->Type == DSD_NODE_OR )
    {
        // print the line
        fprintf( pFile, "OR(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput = Dsd_Regular( pNode->pDecs[i] );
            fCompNew  = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%c", 'a' + pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    else if ( pNode->Type == DSD_NODE_EXOR )
    {
        // print the line
        fprintf( pFile, "EXOR(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput = Dsd_Regular( pNode->pDecs[i] );
            fCompNew  = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%c", 'a' + pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    ABC_FREE( pInputNums );
}